

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::parse_class(Parser *this)

{
  bool bVar1;
  ostream *poVar2;
  bool local_274;
  bool local_271;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  byte local_191;
  string local_190;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  Parser *local_10;
  Parser *this_local;
  
  local_10 = this;
  query_tokenizer(this);
  poVar2 = std::operator<<((ostream *)this->out_file,"<class>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"IDENTIFIER",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"class keyword",&local_69);
  check_token_type_x_after_y(this,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  poVar2 = (ostream *)this->out_file;
  std::operator+(&local_b0,"\t<identifier>",&this->cur_token);
  std::operator+(&local_90,&local_b0,"</identifier>");
  poVar2 = std::operator<<(poVar2,(string *)&local_90);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  Tokenizer::add_type(this->tokenizer,&this->cur_token);
  std::__cxx11::string::operator=((string *)&this->class_name,(string *)&this->cur_token);
  query_tokenizer(this);
  Tokenizer::get_current_token_abi_cxx11_(&local_d0,this->tokenizer);
  bVar1 = std::operator==(&local_d0,"{");
  std::__cxx11::string::~string((string *)&local_d0);
  if (bVar1) {
    poVar2 = (ostream *)this->out_file;
    std::operator+(&local_110,"\t<symbol>",&this->cur_token);
    std::operator+(&local_f0,&local_110,"</symbol>");
    poVar2 = std::operator<<(poVar2,(string *)&local_f0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    query_tokenizer(this);
  }
  else {
    Tokenizer::get_current_token_abi_cxx11_(&local_150,this->tokenizer);
    std::operator+(&local_130,"Compiler Error: expected { instead of the token \'",&local_150);
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&local_130);
    poVar2 = std::operator<<(poVar2,"\'");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
  }
  while( true ) {
    Tokenizer::get_current_token_abi_cxx11_(&local_170,this->tokenizer);
    local_191 = 0;
    bVar1 = std::operator==(&local_170,"static");
    local_271 = true;
    if (!bVar1) {
      Tokenizer::get_current_token_abi_cxx11_(&local_190,this->tokenizer);
      local_191 = 1;
      local_271 = std::operator==(&local_190,"field");
    }
    if ((local_191 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_190);
    }
    std::__cxx11::string::~string((string *)&local_170);
    if (local_271 == false) break;
    parse_class_var_dec(this);
    query_tokenizer(this);
  }
  while( true ) {
    bVar1 = std::operator==(&this->cur_token,"constructor");
    local_274 = true;
    if (!bVar1) {
      bVar1 = std::operator==(&this->cur_token,"function");
      local_274 = true;
      if (!bVar1) {
        local_274 = std::operator==(&this->cur_token,"method");
      }
    }
    if (local_274 == false) break;
    std::__cxx11::string::operator=((string *)&this->cur_subroutine_type,(string *)&this->cur_token)
    ;
    query_tokenizer(this);
    parse_subroutine(this);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"}",&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"class definition",&local_1e1);
  check_expected_x_after_y(this,&local_1b8,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  poVar2 = std::operator<<((ostream *)this->out_file,"</class>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  query_tokenizer(this);
  while (bVar1 = std::operator==(&this->cur_token,"function"), bVar1) {
    std::__cxx11::string::operator=((string *)&this->cur_subroutine_type,"function");
    query_tokenizer(this);
    Symbol_Table::start_subroutine(&this->symbol_table);
    parse_subroutine(this);
  }
  Symbol_Table::free_class(&this->symbol_table);
  return;
}

Assistant:

void Parser::parse_class() {
    // skip class declaration
    query_tokenizer();

    out_file << "<class>" << std::endl;

    check_token_type_x_after_y("IDENTIFIER", "class keyword");
    out_file << "\t<identifier>" + cur_token + "</identifier>" << std::endl;
    tokenizer.add_type(cur_token);
    class_name = cur_token;
    query_tokenizer();

    if (tokenizer.get_current_token() == "{") {
        out_file << "\t<symbol>" + cur_token + "</symbol>" << std::endl;
        query_tokenizer();
    }
    else {
        std::cerr << "Compiler Error: expected { instead of the token '" +
        tokenizer.get_current_token() <<"'" <<std::endl;
    }

    while(tokenizer.get_current_token() == "static" || tokenizer.get_current_token() == "field"){
        parse_class_var_dec();
        query_tokenizer();
    }

    while (cur_token == "constructor"  || cur_token == "function" || cur_token == "method") {
        cur_subroutine_type = cur_token;
        query_tokenizer();
        parse_subroutine();
    }

    check_expected_x_after_y("}", "class definition");
    out_file << "</class>" << std::endl;
    query_tokenizer();

    while (cur_token == "function") {
        cur_subroutine_type = "function";
        query_tokenizer();
        symbol_table.start_subroutine();
        parse_subroutine();
    }

    symbol_table.free_class();
}